

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1a4cc::numeric<long>::validate
          (numeric<long> *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e
          )

{
  long *plVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  __type_conflict _Var6;
  double dVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0 [2];
  json_pointer *local_1c0;
  double local_1b8;
  ostringstream oss;
  
  local_1c0 = ptr;
  lVar3 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<long,_0>(instance);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  if ((lVar3 != 0) && ((this->multipleOf_).first != false)) {
    _Var6 = std::remainder<long,double>(lVar3,(this->multipleOf_).second);
    dVar7 = ABS((double)lVar3 / (this->multipleOf_).second);
    uVar5 = -(ulong)(1.0 < dVar7);
    local_1b8 = (double)(~uVar5 & (ulong)_Var6 | (ulong)(_Var6 / dVar7) & uVar5);
    _Var6 = std::nextafter<long,int>(lVar3,0);
    if (ABS(_Var6 - (double)lVar3) < ABS(local_1b8)) {
      poVar4 = std::operator<<((ostream *)&oss,"instance is not a multiple of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1e0,&(this->multipleOf_).second);
      nlohmann::json_abi_v3_11_2::operator<<(poVar4,local_1e0);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(local_1e0);
    }
  }
  if ((this->maximum_).first == true) {
    plVar1 = &(this->maximum_).second;
    lVar2 = (this->maximum_).second;
    if ((lVar2 <= lVar3 & this->exclusiveMaximum_) == 1) {
      poVar4 = std::operator<<((ostream *)&oss,"instance exceeds or equals maximum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_long_&,_long,_0>(local_1e0,plVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar4,local_1e0);
    }
    else {
      if (lVar3 <= lVar2) goto LAB_00111374;
      poVar4 = std::operator<<((ostream *)&oss,"instance exceeds maximum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_long_&,_long,_0>(local_1e0,plVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar4,local_1e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(local_1e0);
  }
LAB_00111374:
  if ((this->minimum_).first == true) {
    plVar1 = &(this->minimum_).second;
    lVar2 = (this->minimum_).second;
    if ((lVar3 <= lVar2 & this->exclusiveMinimum_) == 1) {
      poVar4 = std::operator<<((ostream *)&oss,"instance is below or equals minimum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_long_&,_long,_0>(local_1e0,plVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar4,local_1e0);
    }
    else {
      if (lVar2 <= lVar3) goto LAB_0011141b;
      poVar4 = std::operator<<((ostream *)&oss,"instance is below minimum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_long_&,_long,_0>(local_1e0,plVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar4,local_1e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(local_1e0);
  }
LAB_0011141b:
  std::ostream::seekp((long)&oss,_S_beg);
  lVar3 = std::ostream::tellp();
  if (lVar3 != 0) {
    std::ostream::seekp((long)&oss,_S_beg);
    std::__cxx11::stringbuf::str();
    (*e->_vptr_error_handler[2])(e,local_1c0,instance,local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		T value = instance; // conversion of json to value_type

		std::ostringstream oss;

		if (multipleOf_.first && value != 0) // zero is multiple of everything
			if (violates_multiple_of(value))
				oss << "instance is not a multiple of " << json(multipleOf_.second);

		if (maximum_.first) {
			if (exclusiveMaximum_ && value >= maximum_.second)
				oss << "instance exceeds or equals maximum of " << json(maximum_.second);
			else if (value > maximum_.second)
				oss << "instance exceeds maximum of " << json(maximum_.second);
		}

		if (minimum_.first) {
			if (exclusiveMinimum_ && value <= minimum_.second)
				oss << "instance is below or equals minimum of " << json(minimum_.second);
			else if (value < minimum_.second)
				oss << "instance is below minimum of " << json(minimum_.second);
		}

		oss.seekp(0, std::ios::end);
		auto size = oss.tellp();
		if (size != 0) {
			oss.seekp(0, std::ios::beg);
			e.error(ptr, instance, oss.str());
		}
	}